

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

void __thiscall mjs::return_statement::~return_statement(return_statement *this)

{
  expression *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__return_statement_001ec790;
  peVar1 = (this->e_)._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  if (peVar1 != (expression *)0x0) {
    (**(code **)((long)(peVar1->super_syntax_node)._vptr_syntax_node + 8))();
  }
  (this->e_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t
  .super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl = (expression *)0x0;
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__syntax_node_001e9040;
  this_00 = (this->super_statement).super_syntax_node.extend_.file.
            super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit return_statement(const source_extend& extend, expression_ptr&& e) : statement(extend), e_(std::move(e)) {}